

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  int *piVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  
  pIVar3 = GImGui;
  if ((1 < (uint)cond) && ((GImGui->DragDropPayload).DataFrameCount != -1)) goto LAB_0011ee45;
  strncpy((GImGui->DragDropPayload).DataType,type,0x20);
  (pIVar3->DragDropPayload).DataType[0x20] = '\0';
  uVar7 = (pIVar3->DragDropPayloadBufHeap).Capacity;
  if ((int)uVar7 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    uVar7 = 0;
    puVar4 = (uchar *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar5 = (pIVar3->DragDropPayloadBufHeap).Data;
    if (puVar5 != (uchar *)0x0) {
      memcpy(puVar4,puVar5,(long)(pIVar3->DragDropPayloadBufHeap).Size);
      puVar5 = (pIVar3->DragDropPayloadBufHeap).Data;
      if ((puVar5 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
    }
    (pIVar3->DragDropPayloadBufHeap).Data = puVar4;
    (pIVar3->DragDropPayloadBufHeap).Capacity = 0;
  }
  (pIVar3->DragDropPayloadBufHeap).Size = 0;
  uVar6 = (uint)data_size;
  if (data_size < 0x11) {
    if (data_size != 0) {
      puVar5 = pIVar3->DragDropPayloadBufLocal;
      pIVar3->DragDropPayloadBufLocal[0] = '\0';
      pIVar3->DragDropPayloadBufLocal[1] = '\0';
      pIVar3->DragDropPayloadBufLocal[2] = '\0';
      pIVar3->DragDropPayloadBufLocal[3] = '\0';
      pIVar3->DragDropPayloadBufLocal[4] = '\0';
      pIVar3->DragDropPayloadBufLocal[5] = '\0';
      pIVar3->DragDropPayloadBufLocal[6] = '\0';
      pIVar3->DragDropPayloadBufLocal[7] = '\0';
      pIVar3->DragDropPayloadBufLocal[8] = '\0';
      pIVar3->DragDropPayloadBufLocal[9] = '\0';
      pIVar3->DragDropPayloadBufLocal[10] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xb] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xc] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xd] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xe] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xf] = '\0';
      (pIVar3->DragDropPayload).Data = puVar5;
      goto LAB_0011ee33;
    }
    (pIVar3->DragDropPayload).Data = (void *)0x0;
  }
  else {
    if ((int)uVar7 < (int)uVar6) {
      uVar8 = 8;
      if (uVar7 != 0) {
        uVar8 = (uVar7 >> 1) + uVar7;
      }
      sVar9 = (size_t)uVar8;
      if (uVar8 <= uVar6) {
        sVar9 = data_size & 0xffffffff;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      puVar5 = (uchar *)(*GImAllocatorAllocFunc)(sVar9,GImAllocatorUserData);
      puVar4 = (pIVar3->DragDropPayloadBufHeap).Data;
      if (puVar4 != (uchar *)0x0) {
        memcpy(puVar5,puVar4,(long)(pIVar3->DragDropPayloadBufHeap).Size);
        puVar4 = (pIVar3->DragDropPayloadBufHeap).Data;
        if ((puVar4 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
      }
      (pIVar3->DragDropPayloadBufHeap).Data = puVar5;
      (pIVar3->DragDropPayloadBufHeap).Capacity = (int)sVar9;
    }
    else {
      puVar5 = (pIVar3->DragDropPayloadBufHeap).Data;
    }
    (pIVar3->DragDropPayloadBufHeap).Size = uVar6;
    (pIVar3->DragDropPayload).Data = puVar5;
LAB_0011ee33:
    memcpy(puVar5,data,data_size);
  }
  (pIVar3->DragDropPayload).DataSize = uVar6;
LAB_0011ee45:
  iVar2 = pIVar3->FrameCount;
  (pIVar3->DragDropPayload).DataFrameCount = iVar2;
  return pIVar3->DragDropAcceptFrameCount == iVar2 + -1 || pIVar3->DragDropAcceptFrameCount == iVar2
  ;
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0);                               // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    // Return whether the payload has been accepted
    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}